

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom
          (AnyMetadata *this,Message *message,string *type_url_prefix)

{
  Descriptor *this_00;
  MessageLite *in_RSI;
  string *in_RDI;
  undefined1 in_stack_000000a0 [16];
  undefined1 in_stack_000000b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string *default_value;
  string *in_stack_ffffffffffffff70;
  ArenaStringPtr *this_01;
  string local_38 [40];
  MessageLite *local_10;
  
  this_01 = *(ArenaStringPtr **)in_RDI;
  local_10 = in_RSI;
  GetEmptyString_abi_cxx11_();
  this_00 = Message::GetDescriptor((Message *)in_stack_ffffffffffffff70);
  Descriptor::full_name_abi_cxx11_(this_00);
  StringPiece::StringPiece<std::allocator<char>>
            ((StringPiece *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  StringPiece::StringPiece<std::allocator<char>>
            ((StringPiece *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  GetTypeUrl_abi_cxx11_((StringPiece)in_stack_000000b0,(StringPiece)in_stack_000000a0);
  ArenaStringPtr::SetNoArena(this_01,in_RDI,in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_38);
  default_value = (string *)in_RDI->_M_string_length;
  GetEmptyStringAlreadyInited_abi_cxx11_();
  ArenaStringPtr::MutableNoArena((ArenaStringPtr *)local_10,default_value);
  MessageLite::SerializeToString(local_10,default_value);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message,
                           const std::string& type_url_prefix) {
  type_url_->SetNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString(),
      GetTypeUrl(message.GetDescriptor()->full_name(), type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited()));
}